

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> * __thiscall
AlignmentRecord::coveredPositions
          (vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           *__return_storage_ptr__,AlignmentRecord *this)

{
  pointer *ppmVar1;
  byte bVar2;
  iterator iVar3;
  bool bVar4;
  char cVar5;
  pointer pcVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint local_54;
  mapValue local_50;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar6 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = __return_storage_ptr__;
  if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar6) {
    local_54 = this->start1;
    uVar8 = 0;
    uVar7 = 0;
    uVar9 = 1;
    do {
      bVar2 = pcVar6[uVar7];
      if (bVar2 < 0x4d) {
        if (bVar2 == 0x44) {
LAB_0016687a:
          local_54 = local_54 + 1;
        }
        else if (bVar2 == 0x49) goto LAB_00166867;
      }
      else {
        if (bVar2 != 0x53) {
          if (bVar2 != 0x4d) goto LAB_0016687e;
          cVar5 = ShortDnaSequence::operator[](&this->sequence1,(long)(int)uVar8);
          local_50.qual = ShortDnaSequence::qualityChar(&this->sequence1,(long)(int)uVar8);
          __return_storage_ptr__ = local_38;
          local_50.ref = local_54;
          local_50.prob =
               (double)*(float *)((anonymous_namespace)::error_probs + (long)local_50.qual * 4);
          local_50.read = 0;
          iVar3._M_current =
               (local_38->
               super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_50.base = cVar5;
          local_50.pir = uVar8;
          if (iVar3._M_current ==
              (local_38->
              super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
            _M_realloc_insert<AlignmentRecord::mapValue>(local_38,iVar3,&local_50);
          }
          else {
            (iVar3._M_current)->pir = (int)(ulong)uVar8;
            (iVar3._M_current)->read = (int)((ulong)uVar8 >> 0x20);
            (iVar3._M_current)->ref = local_54;
            (iVar3._M_current)->base = cVar5;
            (iVar3._M_current)->qual = local_50.qual;
            *(undefined2 *)&(iVar3._M_current)->field_0x6 = local_50._6_2_;
            (iVar3._M_current)->prob = local_50.prob;
            ppmVar1 = &(local_38->
                       super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppmVar1 = *ppmVar1 + 1;
          }
          uVar8 = uVar8 + 1;
          goto LAB_0016687a;
        }
LAB_00166867:
        uVar8 = uVar8 + 1;
      }
LAB_0016687e:
      pcVar6 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar4 = uVar9 < (ulong)((long)(this->cigar1_unrolled).
                                    super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pcVar6);
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar4);
  }
  if ((this->single_end == false) &&
     (pcVar6 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
     (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
     super__Vector_impl_data._M_finish != pcVar6)) {
    local_54 = this->start2;
    uVar8 = 0;
    uVar7 = 0;
    uVar9 = 1;
    do {
      bVar2 = pcVar6[uVar7];
      if (bVar2 < 0x4d) {
        if (bVar2 == 0x44) {
LAB_00166993:
          local_54 = local_54 + 1;
        }
        else if (bVar2 == 0x49) goto LAB_00166980;
      }
      else {
        if (bVar2 != 0x53) {
          if (bVar2 != 0x4d) goto LAB_00166997;
          cVar5 = ShortDnaSequence::operator[](&this->sequence2,(long)(int)uVar8);
          local_50.qual = ShortDnaSequence::qualityChar(&this->sequence2,(long)(int)uVar8);
          __return_storage_ptr__ = local_38;
          local_50.ref = local_54;
          local_50.prob =
               (double)*(float *)((anonymous_namespace)::error_probs + (long)local_50.qual * 4);
          local_50.read = 1;
          iVar3._M_current =
               (local_38->
               super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_50.base = cVar5;
          local_50.pir = uVar8;
          if (iVar3._M_current ==
              (local_38->
              super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
            _M_realloc_insert<AlignmentRecord::mapValue>(local_38,iVar3,&local_50);
          }
          else {
            (iVar3._M_current)->pir = uVar8;
            (iVar3._M_current)->read = 1;
            (iVar3._M_current)->ref = local_54;
            (iVar3._M_current)->base = cVar5;
            (iVar3._M_current)->qual = local_50.qual;
            *(undefined2 *)&(iVar3._M_current)->field_0x6 = local_50._6_2_;
            (iVar3._M_current)->prob = local_50.prob;
            ppmVar1 = &(local_38->
                       super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppmVar1 = *ppmVar1 + 1;
          }
          uVar8 = uVar8 + 1;
          goto LAB_00166993;
        }
LAB_00166980:
        uVar8 = uVar8 + 1;
      }
LAB_00166997:
      pcVar6 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar4 = uVar9 < (ulong)((long)(this->cigar2_unrolled).
                                    super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pcVar6);
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<AlignmentRecord::mapValue> AlignmentRecord::coveredPositions() const{
    std::vector<AlignmentRecord::mapValue> cov_positions;
    //position in ref
    int r = this->start1;
    //position in querybases / quality string of read
    int q = 0;
    for (unsigned int i = 0; i< this->cigar1_unrolled.size(); ++i){
        char c = this->cigar1_unrolled[i];
        switch(c){
            case 'M': {
                c = this->sequence1[q];
                char qual = this->sequence1.qualityChar(q);
                cov_positions.push_back({r,c,qual,error_probs[qual],q,0});
                //char d = this->sequence1[q];
                ++q;
                ++r;
                break;
            }
            case 'D': {
                ++r;
                break;
            }
            case 'S':
            case 'I': {
                ++q;
                break;
            }
            case 'H':
                break;
        }
    }
    //In case of a paired end read
    if (!this->single_end){
        assert(this->start1 <= this->start2);
            //position in ref
            r = this->start2;
            //position in query bases
            q = 0;
            //in case of overlapping paired end it is declared as a single end
            //if (r <= this->end1){
            //   this->single_end = true;
            //}
            for (unsigned int i = 0; i< this->cigar2_unrolled.size(); ++i){
                char c = this->cigar2_unrolled[i];
                switch(c){
                    case 'M': {
                        c = this->sequence2[q];
                        char qual = this->sequence2.qualityChar(q);
                        cov_positions.push_back({r,c,qual,error_probs[qual],q,1});
                        ++q;
                        ++r;
                        break;
                    }
                    case 'D': {
                        ++r;
                        break;
                    }
                    case 'S':
                    case 'I': {
                        ++q;
                        break;
                    }
                    case 'H':
                        break;
              }
           }
        }
    return cov_positions;
}